

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_table_as_root_with_size
              (void *buf,size_t bufsiz,char *fid,flatcc_table_verifier_f *tvf)

{
  size_t buf_00;
  int iVar1;
  flatbuffers_uoffset_t end;
  flatbuffers_uoffset_t offset;
  flatcc_table_verifier_f *tvf_local;
  char *fid_local;
  size_t bufsiz_local;
  void *buf_local;
  
  fid_local = (char *)bufsiz;
  bufsiz_local = (size_t)buf;
  iVar1 = flatcc_verify_buffer_header_with_size(buf,(size_t *)&fid_local,fid);
  buf_00 = bufsiz_local;
  if (iVar1 == 0) {
    end = (flatbuffers_uoffset_t)fid_local;
    offset = read_uoffset((void *)bufsiz_local,4);
    buf_local._4_4_ = verify_table((void *)buf_00,end,4,offset,100,tvf);
  }
  else {
    buf_local._4_4_ =
         flatcc_verify_buffer_header_with_size((void *)bufsiz_local,(size_t *)&fid_local,fid);
  }
  return buf_local._4_4_;
}

Assistant:

int flatcc_verify_table_as_root_with_size(const void *buf, size_t bufsiz, const char *fid, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_buffer_header_with_size(buf, &bufsiz, fid));
    return verify_table(buf, (uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}